

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void expr_toreg_nobranch(FuncState *fs,ExpDesc *e,BCReg reg)

{
  anon_union_8_3_2ce71dea_for_u aVar1;
  uint uVar2;
  ExpKind EVar3;
  
  expr_discharge(fs,e);
  EVar3 = e->k;
  switch(EVar3) {
  case VKNIL:
    bcemit_nil(fs,reg,1);
    goto LAB_0011943e;
  default:
    uVar2 = 0x2b;
    if (VKTRUE < EVar3) {
      return;
    }
    break;
  case VKSTR:
    EVar3 = const_gc(fs,(GCobj *)(e->u).sval,0xfffffffb);
    uVar2 = 0x27;
    break;
  case VKLAST:
    aVar1 = e->u;
    EVar3 = (ExpKind)(double)aVar1;
    if ((int)(short)EVar3 == EVar3) {
      uVar2 = 0x29;
      if (((double)aVar1 == (double)(int)(double)aVar1) &&
         (!NAN((double)aVar1) && !NAN((double)(int)(double)aVar1))) break;
    }
    EVar3 = const_num(fs,e);
    uVar2 = 0x2a;
    break;
  case VKCDATA:
    fs->flags = fs->flags | 4;
    EVar3 = const_gc(fs,(GCobj *)((ulong)(e->u).sval & 0x7fffffffffff),0xfffffff5);
    uVar2 = 0x28;
    break;
  case VRELOCABLE:
    *(char *)((long)&fs->bcbase[(e->u).s.info].ins + 1) = (char)reg;
    goto LAB_0011943e;
  case VNONRELOC:
    EVar3 = (e->u).s.info;
    uVar2 = 0x12;
    if (EVar3 == reg) goto LAB_0011943e;
  }
  bcemit_INS(fs,EVar3 << 0x10 | reg << 8 | uVar2);
LAB_0011943e:
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void expr_toreg_nobranch(FuncState *fs, ExpDesc *e, BCReg reg)
{
  BCIns ins;
  expr_discharge(fs, e);
  if (e->k == VKSTR) {
    ins = BCINS_AD(BC_KSTR, reg, const_str(fs, e));
  } else if (e->k == VKNUM) {
#if LJ_DUALNUM
    cTValue *tv = expr_numtv(e);
    if (tvisint(tv) && checki16(intV(tv)))
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)intV(tv));
    else
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checki16(k) && n == (lua_Number)k)
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)k);
    else
#endif
      ins = BCINS_AD(BC_KNUM, reg, const_num(fs, e));
#if LJ_HASFFI
  } else if (e->k == VKCDATA) {
    fs->flags |= PROTO_FFI;
    ins = BCINS_AD(BC_KCDATA, reg,
		   const_gc(fs, obj2gco(cdataV(&e->u.nval)), LJ_TCDATA));
#endif
  } else if (e->k == VRELOCABLE) {
    setbc_a(bcptr(fs, e), reg);
    goto noins;
  } else if (e->k == VNONRELOC) {
    if (reg == e->u.s.info)
      goto noins;
    ins = BCINS_AD(BC_MOV, reg, e->u.s.info);
  } else if (e->k == VKNIL) {
    bcemit_nil(fs, reg, 1);
    goto noins;
  } else if (e->k <= VKTRUE) {
    ins = BCINS_AD(BC_KPRI, reg, const_pri(e));
  } else {
    lj_assertFS(e->k == VVOID || e->k == VJMP, "bad expr type %d", e->k);
    return;
  }
  bcemit_INS(fs, ins);
noins:
  e->u.s.info = reg;
  e->k = VNONRELOC;
}